

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

double __thiscall
wasm::Random::pickGivenNum<double,long,unsigned_int,unsigned_long>
          (Random *this,size_t num,double first,long args,uint args_1,unsigned_long args_2)

{
  double dVar1;
  
  if (num != 0) {
    dVar1 = pickGivenNum<double,unsigned_int,unsigned_long>(this,num - 1,(double)args,args_1,args_2)
    ;
    return dVar1;
  }
  return first;
}

Assistant:

T pickGivenNum(size_t num, T first, Args... args) {
    if (num == 0) {
      return first;
    }
    return pickGivenNum<T>(num - 1, args...);
  }